

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

void google::protobuf::internal::ReflectionOps::DiscardUnknownFields(Message *message)

{
  FieldDescriptor *this;
  bool bVar1;
  CppType CVar2;
  int iVar3;
  Reflection *this_00;
  UnknownFieldSet *this_01;
  Descriptor *pDVar4;
  MapFieldBase *this_02;
  Message *pMVar5;
  ulong uVar6;
  int index;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator iter;
  MapIterator end;
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_a8;
  MapIterator local_90;
  MapIterator local_60;
  
  this_00 = GetReflectionOrDie(message);
  this_01 = Reflection::MutableUnknownFields(this_00,message);
  UnknownFieldSet::Clear(this_01);
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields
            (this_00,message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&local_a8);
  uVar6 = 0;
  do {
    if ((ulong)((long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                (long)local_a8._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar6) {
      std::
      _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~_Vector_base(&local_a8);
      return;
    }
    this = local_a8._M_impl.super__Vector_impl_data._M_start[uVar6];
    CVar2 = FieldDescriptor::cpp_type(this);
    if (CVar2 == CPPTYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_map(this);
      if (bVar1) {
        pDVar4 = FieldDescriptor::message_type(this);
        CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)(*(long *)(pDVar4 + 0x28) + 0x98));
        if (CVar2 == CPPTYPE_MESSAGE) {
          this_02 = Reflection::MutableMapData(this_00,message,this);
          bVar1 = MapFieldBase::IsMapValid(this_02);
          if (bVar1) {
            MapIterator::MapIterator(&local_90,message,this);
            MapIterator::MapIterator(&local_60,message,this);
            (*this_02->_vptr_MapFieldBase[6])(this_02,&local_90);
            (*this_02->_vptr_MapFieldBase[7])(this_02,&local_60);
            while( true ) {
              iVar3 = (*(local_90.map_)->_vptr_MapFieldBase[5])(local_90.map_,&local_90,&local_60);
              if ((char)iVar3 != '\0') break;
              MapFieldBase::SetMapDirty(local_90.map_);
              pMVar5 = MapValueRef::MutableMessageValue(&local_90.value_);
              (*(pMVar5->super_MessageLite)._vptr_MessageLite[0x12])(pMVar5);
              (*(local_90.map_)->_vptr_MapFieldBase[0x12])(local_90.map_,&local_90);
            }
            MapIterator::~MapIterator(&local_60);
            MapIterator::~MapIterator(&local_90);
          }
          goto LAB_0026cac2;
        }
      }
      if (*(int *)(this + 0x3c) == 3) {
        iVar3 = Reflection::FieldSize(this_00,message,this);
        index = 0;
        if (iVar3 < 1) {
          iVar3 = index;
        }
        for (; iVar3 != index; index = index + 1) {
          pMVar5 = Reflection::MutableRepeatedMessage(this_00,message,this,index);
          (*(pMVar5->super_MessageLite)._vptr_MessageLite[0x12])(pMVar5);
        }
      }
      else {
        pMVar5 = Reflection::MutableMessage(this_00,message,this,(MessageFactory *)0x0);
        (*(pMVar5->super_MessageLite)._vptr_MessageLite[0x12])(pMVar5);
      }
    }
LAB_0026cac2:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void ReflectionOps::DiscardUnknownFields(Message* message) {
  const Reflection* reflection = GetReflectionOrDie(*message);

  reflection->MutableUnknownFields(message)->Clear();

  // Walk through the fields of this message and DiscardUnknownFields on any
  // messages present.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (int i = 0; i < fields.size(); i++) {
    const FieldDescriptor* field = fields[i];
    // Skip over non-message fields.
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
      continue;
    }
    // Discard the unknown fields in maps that contain message values.
    if (field->is_map() && IsMapValueMessageTyped(field)) {
      const MapFieldBase* map_field =
          reflection->MutableMapData(message, field);
      if (map_field->IsMapValid()) {
        MapIterator iter(message, field);
        MapIterator end(message, field);
        for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
             ++iter) {
          iter.MutableValueRef()->MutableMessageValue()->DiscardUnknownFields();
        }
      }
      // Discard every unknown field inside messages in a repeated field.
    } else if (field->is_repeated()) {
      int size = reflection->FieldSize(*message, field);
      for (int j = 0; j < size; j++) {
        reflection->MutableRepeatedMessage(message, field, j)
            ->DiscardUnknownFields();
      }
      // Discard the unknown fields inside an optional message.
    } else {
      reflection->MutableMessage(message, field)->DiscardUnknownFields();
    }
  }
}